

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QMultiHash<QByteArray,_QByteArray>::QMultiHash
          (QMultiHash<QByteArray,_QByteArray> *this,QHash<QByteArray,_QByteArray> *other)

{
  ulong uVar1;
  ulong uVar2;
  Data *pDVar3;
  const_iterator f;
  
  pDVar3 = other->d;
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else if (pDVar3->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar2 = uVar1;
      if (pDVar3->numBuckets == uVar2) {
        pDVar3 = (Data *)0x0;
        uVar2 = 0;
        break;
      }
      uVar1 = uVar2 + 1;
    } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
    goto LAB_0010bb0a;
  }
  uVar2 = 0;
LAB_0010bb0a:
  f.i.bucket = uVar2;
  f.i.d = pDVar3;
  QMultiHash<QHash<QByteArray,_QByteArray>::const_iterator,_true>(this,f,(const_iterator)ZEXT816(0))
  ;
  return;
}

Assistant:

inline const_iterator begin() const noexcept { return d ? const_iterator(d->begin()): const_iterator(); }